

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O0

int __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::init(BufferAgeTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  bool bVar1;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar2;
  Library *pLVar3;
  EGLConfig pvVar4;
  NotSupportedError *pNVar5;
  GLES2Renderer *this_01;
  ReferenceRenderer *this_02;
  allocator<char> local_49;
  string local_48;
  deUint32 local_28;
  Library *local_18;
  Library *egl;
  BufferAgeTest *this_local;
  
  egl = (Library *)this;
  local_18 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar2 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_eglDisplay = pvVar2;
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar4 = getEGLConfig(pLVar3,this->m_eglDisplay,(bool)(this->m_preserveColorBuffer & 1));
  this->m_eglConfig = pvVar4;
  if (this->m_eglConfig == (EGLConfig)0x0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"No supported config found",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
               ,0x188);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  initEGLSurface(this,this->m_eglConfig);
  initEGLContext(this,this->m_eglConfig);
  this_00 = (this->super_TestCase).m_eglTestCtx;
  local_28 = (deUint32)glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,(ApiType)local_28);
  pLVar3 = local_18;
  pvVar2 = this->m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"EGL_EXT_buffer_age",&local_49);
  bVar1 = eglu::hasExtension(pLVar3,pvVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (!bVar1) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,"EGL_EXT_buffer_age is not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglBufferAgeTests.cpp"
               ,0x191);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  this_01 = (GLES2Renderer *)operator_new(0xe0);
  GLES2Renderer::GLES2Renderer(this_01,&this->m_gl);
  this->m_gles2Renderer = this_01;
  this_02 = (ReferenceRenderer *)operator_new(1);
  ReferenceRenderer::ReferenceRenderer(this_02);
  this->m_refRenderer = this_02;
  return (int)this;
}

Assistant:

void BufferAgeTest::init (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	m_eglDisplay = eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig	 = getEGLConfig(m_eglTestCtx.getLibrary(), m_eglDisplay, m_preserveColorBuffer);

	if (m_eglConfig == DE_NULL)
		TCU_THROW(NotSupportedError, "No supported config found");

	//create surface and context and make them current
	initEGLSurface(m_eglConfig);
	initEGLContext(m_eglConfig);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	if (eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_buffer_age") == false)
		TCU_THROW(NotSupportedError, "EGL_EXT_buffer_age is not supported");

	m_gles2Renderer = new GLES2Renderer(m_gl);
	m_refRenderer   = new ReferenceRenderer();
}